

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_32x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  int y_mask;
  uint uVar27;
  uint8_t *puVar28;
  short sVar29;
  short sVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  short sVar33;
  ushort uVar34;
  short sVar35;
  ushort uVar36;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  undefined1 auVar37 [16];
  short sVar43;
  ushort uVar44;
  ushort uVar45;
  short sVar46;
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar47 [16];
  ushort uVar61;
  ushort uVar62;
  short sVar63;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar64 [16];
  short sVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  
  auVar31 = _DAT_00b97cd0;
  auVar30 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar1._0_13_;
  auVar4[0xe] = auVar1[7];
  auVar6[0xc] = auVar1[6];
  auVar6._0_12_ = auVar1._0_12_;
  auVar6._13_2_ = auVar4._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar1._0_11_;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10[10] = auVar1[5];
  auVar10._0_10_ = auVar1._0_10_;
  auVar10._11_4_ = auVar8._11_4_;
  auVar12[9] = 0;
  auVar12._0_9_ = auVar1._0_9_;
  auVar12._10_5_ = auVar10._10_5_;
  auVar14[8] = auVar1[4];
  auVar14._0_8_ = auVar1._0_8_;
  auVar14._9_6_ = auVar12._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar14._8_7_;
  Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),auVar1[3]);
  auVar23._9_6_ = 0;
  auVar23._0_9_ = Var17;
  auVar18._1_10_ = SUB1510(auVar23 << 0x30,5);
  auVar18[0] = auVar1[2];
  auVar24._11_4_ = 0;
  auVar24._0_11_ = auVar18;
  auVar19._1_12_ = SUB1512(auVar24 << 0x20,3);
  auVar19[0] = auVar1[1];
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar2._0_13_;
  auVar3[0xe] = auVar2[7];
  auVar5[0xc] = auVar2[6];
  auVar5._0_12_ = auVar2._0_12_;
  auVar5._13_2_ = auVar3._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar2._0_11_;
  auVar7._12_3_ = auVar5._12_3_;
  auVar9[10] = auVar2[5];
  auVar9._0_10_ = auVar2._0_10_;
  auVar9._11_4_ = auVar7._11_4_;
  auVar11[9] = 0;
  auVar11._0_9_ = auVar2._0_9_;
  auVar11._10_5_ = auVar9._10_5_;
  auVar13[8] = auVar2[4];
  auVar13._0_8_ = auVar2._0_8_;
  auVar13._9_6_ = auVar11._9_6_;
  auVar20._7_8_ = 0;
  auVar20._0_7_ = auVar13._8_7_;
  Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),auVar2[3]);
  auVar25._9_6_ = 0;
  auVar25._0_9_ = Var21;
  auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
  auVar22[0] = auVar2[2];
  auVar26._11_4_ = 0;
  auVar26._0_11_ = auVar22;
  auVar15[2] = auVar2[1];
  auVar15._0_2_ = auVar2._0_2_;
  auVar15._3_12_ = SUB1512(auVar26 << 0x20,3);
  uVar34 = auVar2._0_2_ & 0xff;
  sVar29 = auVar30._0_2_;
  sVar32 = auVar30._2_2_;
  auVar30._2_2_ = sVar32 * 0x1f;
  auVar30._0_2_ = sVar29;
  auVar30._4_2_ = sVar29 * 0x3c;
  auVar30._6_2_ = sVar32 * 0x56;
  auVar30._8_2_ = sVar29 * 0x6f;
  auVar30._10_2_ = sVar32 * 0x85;
  auVar30._12_2_ = sVar29 * 0x9a;
  auVar30._14_2_ = sVar32 * 0xac;
  puVar28 = dst + 0x10;
  uVar27 = 0x1000100;
  while( true ) {
    auVar37 = _DAT_00b97cf0;
    sVar33 = (short)Var17;
    uVar45 = auVar4._13_2_ >> 8;
    sVar35 = (short)Var21;
    uVar36 = auVar3._13_2_ >> 8;
    if (0xf0e0f0e < uVar27) break;
    auVar47._4_4_ = uVar27;
    auVar47._0_4_ = uVar27;
    auVar47._8_4_ = uVar27;
    auVar47._12_4_ = uVar27;
    auVar37 = pshufb(auVar31,auVar47);
    auVar64 = pshufb(auVar30,auVar47);
    sVar38 = auVar37._0_2_;
    sVar39 = auVar37._2_2_;
    sVar40 = auVar37._4_2_;
    sVar41 = auVar37._6_2_;
    sVar42 = auVar37._8_2_;
    sVar43 = auVar37._10_2_;
    sVar46 = auVar37._12_2_;
    sVar50 = auVar37._14_2_;
    sVar63 = auVar64._0_2_ + 0x80;
    sVar65 = auVar64._2_2_ + 0x80;
    sVar66 = auVar64._4_2_ + 0x80;
    sVar67 = auVar64._6_2_ + 0x80;
    sVar68 = auVar64._8_2_ + 0x80;
    sVar69 = auVar64._10_2_ + 0x80;
    sVar70 = auVar64._12_2_ + 0x80;
    sVar71 = auVar64._14_2_ + 0x80;
    uVar44 = sVar38 * (ushort)auVar1[0] + sVar63;
    uVar48 = sVar39 * auVar19._0_2_ + sVar65;
    uVar51 = sVar40 * auVar18._0_2_ + sVar66;
    uVar53 = sVar41 * sVar33 + sVar67;
    uVar55 = sVar42 * auVar14._8_2_ + sVar68;
    uVar57 = sVar43 * auVar10._10_2_ + sVar69;
    uVar59 = sVar46 * auVar6._12_2_ + sVar70;
    uVar61 = sVar50 * uVar45 + sVar71;
    uVar45 = uVar44 >> 8;
    uVar49 = uVar48 >> 8;
    uVar52 = uVar51 >> 8;
    uVar54 = uVar53 >> 8;
    uVar56 = uVar55 >> 8;
    uVar58 = uVar57 >> 8;
    uVar60 = uVar59 >> 8;
    uVar62 = uVar61 >> 8;
    uVar73 = sVar38 * (ushort)auVar1[8] + sVar63;
    uVar75 = sVar39 * (ushort)auVar1[9] + sVar65;
    uVar77 = sVar40 * (ushort)auVar1[10] + sVar66;
    uVar79 = sVar41 * (ushort)auVar1[0xb] + sVar67;
    uVar81 = sVar42 * (ushort)auVar1[0xc] + sVar68;
    uVar83 = sVar43 * (ushort)auVar1[0xd] + sVar69;
    uVar85 = sVar46 * (ushort)auVar1[0xe] + sVar70;
    uVar87 = sVar50 * (ushort)auVar1[0xf] + sVar71;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar80 = uVar79 >> 8;
    uVar82 = uVar81 >> 8;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    puVar28[-0x10] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
    puVar28[-0xf] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    puVar28[-0xe] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    puVar28[-0xd] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
    puVar28[-0xc] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    puVar28[-0xb] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
    puVar28[-10] = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
    puVar28[-9] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
    puVar28[-8] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    puVar28[-7] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar28[-6] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar28[-5] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar28[-4] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar28[-3] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar28[-2] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar28[-1] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    uVar62 = sVar38 * uVar34 + sVar63;
    uVar74 = sVar39 * auVar15._2_2_ + sVar65;
    uVar76 = sVar40 * auVar22._0_2_ + sVar66;
    uVar78 = sVar41 * sVar35 + sVar67;
    uVar80 = sVar42 * auVar13._8_2_ + sVar68;
    uVar82 = sVar43 * auVar9._10_2_ + sVar69;
    uVar84 = sVar46 * auVar5._12_2_ + sVar70;
    uVar86 = sVar50 * uVar36 + sVar71;
    uVar73 = uVar62 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar45 = sVar38 * (ushort)auVar2[8] + sVar63;
    uVar44 = sVar39 * (ushort)auVar2[9] + sVar65;
    uVar49 = sVar40 * (ushort)auVar2[10] + sVar66;
    uVar52 = sVar41 * (ushort)auVar2[0xb] + sVar67;
    uVar54 = sVar42 * (ushort)auVar2[0xc] + sVar68;
    uVar56 = sVar43 * (ushort)auVar2[0xd] + sVar69;
    uVar58 = sVar46 * (ushort)auVar2[0xe] + sVar70;
    uVar60 = sVar50 * (ushort)auVar2[0xf] + sVar71;
    uVar36 = uVar45 >> 8;
    uVar48 = uVar44 >> 8;
    uVar51 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar55 = uVar54 >> 8;
    uVar57 = uVar56 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    *puVar28 = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar73);
    puVar28[1] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar28[2] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar28[3] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar28[4] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar28[5] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    puVar28[6] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar28[7] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar28[8] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar36);
    puVar28[9] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar48);
    puVar28[10] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar51);
    puVar28[0xb] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    puVar28[0xc] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar28[0xd] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
    puVar28[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar28[0xf] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    uVar27 = uVar27 + 0x2020202;
    puVar28 = puVar28 + stride;
  }
  auVar31._0_2_ = sVar29 * 0xbc;
  auVar31._2_2_ = sVar32 * 0xca;
  auVar31._4_2_ = sVar29 * 0xd5;
  auVar31._6_2_ = sVar32 * 0xdf;
  auVar31._8_2_ = sVar29 * 0xe6;
  auVar31._10_2_ = sVar32 * 0xec;
  auVar31._12_2_ = sVar29 * 0xef;
  auVar31._14_2_ = sVar32 * 0xf0;
  for (uVar27 = 0x1000100; uVar27 < 0xf0e0f0f; uVar27 = uVar27 + 0x2020202) {
    auVar64._4_4_ = uVar27;
    auVar64._0_4_ = uVar27;
    auVar64._8_4_ = uVar27;
    auVar64._12_4_ = uVar27;
    auVar30 = pshufb(auVar37,auVar64);
    auVar64 = pshufb(auVar31,auVar64);
    sVar29 = auVar30._0_2_;
    sVar32 = auVar30._2_2_;
    sVar38 = auVar30._4_2_;
    sVar39 = auVar30._6_2_;
    sVar40 = auVar30._8_2_;
    sVar41 = auVar30._10_2_;
    sVar42 = auVar30._12_2_;
    sVar43 = auVar30._14_2_;
    sVar46 = auVar64._0_2_ + 0x80;
    sVar50 = auVar64._2_2_ + 0x80;
    sVar63 = auVar64._4_2_ + 0x80;
    sVar65 = auVar64._6_2_ + 0x80;
    sVar66 = auVar64._8_2_ + 0x80;
    sVar67 = auVar64._10_2_ + 0x80;
    sVar68 = auVar64._12_2_ + 0x80;
    sVar69 = auVar64._14_2_ + 0x80;
    uVar44 = sVar29 * (ushort)auVar1[0] + sVar46;
    uVar49 = sVar32 * auVar19._0_2_ + sVar50;
    uVar52 = sVar38 * auVar18._0_2_ + sVar63;
    uVar54 = sVar39 * sVar33 + sVar65;
    uVar56 = sVar40 * auVar14._8_2_ + sVar66;
    uVar58 = sVar41 * auVar10._10_2_ + sVar67;
    uVar60 = sVar42 * auVar6._12_2_ + sVar68;
    uVar62 = sVar43 * uVar45 + sVar69;
    uVar48 = uVar44 >> 8;
    uVar51 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar55 = uVar54 >> 8;
    uVar57 = uVar56 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar73 = uVar62 >> 8;
    uVar74 = sVar29 * (ushort)auVar1[8] + sVar46;
    uVar76 = sVar32 * (ushort)auVar1[9] + sVar50;
    uVar78 = sVar38 * (ushort)auVar1[10] + sVar63;
    uVar80 = sVar39 * (ushort)auVar1[0xb] + sVar65;
    uVar82 = sVar40 * (ushort)auVar1[0xc] + sVar66;
    uVar84 = sVar41 * (ushort)auVar1[0xd] + sVar67;
    uVar86 = sVar42 * (ushort)auVar1[0xe] + sVar68;
    uVar88 = sVar43 * (ushort)auVar1[0xf] + sVar69;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar72 = uVar88 >> 8;
    puVar28[-0x10] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar48);
    puVar28[-0xf] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar51);
    puVar28[-0xe] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    puVar28[-0xd] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar28[-0xc] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
    puVar28[-0xb] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar28[-10] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    puVar28[-9] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar73);
    puVar28[-8] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar28[-7] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar28[-6] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar28[-5] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar28[-4] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    puVar28[-3] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar28[-2] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar28[-1] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar72);
    uVar74 = sVar29 * uVar34 + sVar46;
    uVar76 = sVar32 * auVar15._2_2_ + sVar50;
    uVar78 = sVar38 * auVar22._0_2_ + sVar63;
    uVar80 = sVar39 * sVar35 + sVar65;
    uVar82 = sVar40 * auVar13._8_2_ + sVar66;
    uVar84 = sVar41 * auVar9._10_2_ + sVar67;
    uVar86 = sVar42 * auVar5._12_2_ + sVar68;
    uVar88 = sVar43 * uVar36 + sVar69;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar72 = uVar88 >> 8;
    uVar44 = sVar29 * (ushort)auVar2[8] + sVar46;
    uVar49 = sVar32 * (ushort)auVar2[9] + sVar50;
    uVar52 = sVar38 * (ushort)auVar2[10] + sVar63;
    uVar54 = sVar39 * (ushort)auVar2[0xb] + sVar65;
    uVar56 = sVar40 * (ushort)auVar2[0xc] + sVar66;
    uVar58 = sVar41 * (ushort)auVar2[0xd] + sVar67;
    uVar60 = sVar42 * (ushort)auVar2[0xe] + sVar68;
    uVar62 = sVar43 * (ushort)auVar2[0xf] + sVar69;
    uVar48 = uVar44 >> 8;
    uVar51 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar55 = uVar54 >> 8;
    uVar57 = uVar56 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar73 = uVar62 >> 8;
    *puVar28 = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar28[1] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar28[2] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar28[3] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar28[4] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    puVar28[5] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar28[6] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar28[7] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar72);
    puVar28[8] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar48);
    puVar28[9] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar51);
    puVar28[10] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    puVar28[0xb] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar28[0xc] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
    puVar28[0xd] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar28[0xe] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    puVar28[0xf] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar73);
    puVar28 = puVar28 + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_32x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = _mm_unpackhi_epi8(weights, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}